

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cDrawIndirectTests.cpp
# Opt level: O2

long __thiscall
glcts::anon_unknown_0::DrawIndirectBase::StateValidate<glcts::(anonymous_namespace)::test_api::ES3>
          (DrawIndirectBase *this,GLboolean mapped,GLbitfield access,GLbitfield accessFlag,
          GLintptr offset,GLsizeiptr length)

{
  GLboolean value;
  GLboolean value_00;
  char (*pacVar1) [13];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *t;
  CallLogWrapper *this_00;
  int v;
  DIResult result;
  uint local_390;
  GLbitfield local_38c;
  GLsizeiptr local_388;
  GLintptr local_380;
  string local_378;
  string local_358;
  DILogger local_338;
  DIResult local_1b8;
  
  local_38c = accessFlag;
  local_388 = length;
  local_380 = offset;
  DIResult::DIResult(&local_1b8);
  this_00 = &(this->super_SubcaseBase).super_GLWrapper.super_CallLogWrapper;
  glu::CallLogWrapper::glGetBufferParameteriv(this_00,0x8f3f,0x911f,(GLint *)&local_390);
  if (local_390 != accessFlag) {
    DIResult::error(&local_338,&local_1b8);
    glcts::(anonymous_namespace)::DILogger::operator<<
              ((DILogger *)&local_338,
               (char (*) [74])
               "glGetBufferParameteriv(GL_BUFFER_ACCESS_FLAGS) returned incorrect state: ");
    pacVar1 = (char (*) [13])&local_390;
    glcts::(anonymous_namespace)::DILogger::operator<<((DILogger *)&local_338,(int *)pacVar1);
    glcts::(anonymous_namespace)::DILogger::operator<<((DILogger *)&local_338,pacVar1);
    glcts::(anonymous_namespace)::DILogger::operator<<((DILogger *)&local_338,&local_38c);
    DILogger::~DILogger(&local_338);
  }
  glu::CallLogWrapper::glGetBufferParameteriv(this_00,0x8f3f,0x88bc,(GLint *)&local_390);
  if (local_390 != mapped) {
    DIResult::error(&local_338,&local_1b8);
    glcts::(anonymous_namespace)::DILogger::operator<<
              ((DILogger *)&local_338,
               (char (*) [68])"glGetBufferParameteriv(GL_BUFFER_MAPPED) returned incorrect state: ")
    ;
    glcts::(anonymous_namespace)::DrawIndirectBase::BoolToString_abi_cxx11_
              (&local_358,(DrawIndirectBase *)(ulong)(byte)local_390,value);
    t = &local_358;
    glcts::(anonymous_namespace)::DILogger::operator<<((DILogger *)&local_338,t);
    glcts::(anonymous_namespace)::DILogger::operator<<((DILogger *)&local_338,(char (*) [13])t);
    glcts::(anonymous_namespace)::DrawIndirectBase::BoolToString_abi_cxx11_
              (&local_378,(DrawIndirectBase *)(ulong)(access & 0xff),value_00);
    glcts::(anonymous_namespace)::DILogger::operator<<((DILogger *)&local_338,&local_378);
    std::__cxx11::string::~string((string *)&local_378);
    std::__cxx11::string::~string((string *)&local_358);
    DILogger::~DILogger(&local_338);
  }
  glu::CallLogWrapper::glGetBufferParameteriv(this_00,0x8f3f,0x9121,(GLint *)&local_390);
  if ((int)local_390 != offset) {
    DIResult::error(&local_338,&local_1b8);
    glcts::(anonymous_namespace)::DILogger::operator<<
              ((DILogger *)&local_338,
               (char (*) [73])
               "glGetBufferParameteriv(GL_BUFFER_MAP_OFFSET) returned incorrect offset: ");
    pacVar1 = (char (*) [13])&local_390;
    glcts::(anonymous_namespace)::DILogger::operator<<((DILogger *)&local_338,(int *)pacVar1);
    glcts::(anonymous_namespace)::DILogger::operator<<((DILogger *)&local_338,pacVar1);
    glcts::(anonymous_namespace)::DILogger::operator<<((DILogger *)&local_338,&local_380);
    DILogger::~DILogger(&local_338);
  }
  glu::CallLogWrapper::glGetBufferParameteriv(this_00,0x8f3f,0x9120,(GLint *)&local_390);
  if ((int)local_390 != length) {
    DIResult::error(&local_338,&local_1b8);
    glcts::(anonymous_namespace)::DILogger::operator<<
              ((DILogger *)&local_338,
               (char (*) [73])
               "glGetBufferParameteriv(GL_BUFFER_MAP_LENGTH) returned incorrect length: ");
    pacVar1 = (char (*) [13])&local_390;
    glcts::(anonymous_namespace)::DILogger::operator<<((DILogger *)&local_338,(int *)pacVar1);
    glcts::(anonymous_namespace)::DILogger::operator<<((DILogger *)&local_338,pacVar1);
    glcts::(anonymous_namespace)::DILogger::operator<<((DILogger *)&local_338,&local_388);
    DILogger::~DILogger(&local_338);
  }
  DILogger::~DILogger(&local_1b8.logger_);
  return local_1b8.status_;
}

Assistant:

long StateValidate(GLboolean mapped, GLbitfield access, GLbitfield accessFlag, GLintptr offset, GLsizeiptr length)
	{
		DIResult result;

		if (!api::isES())
		{
			int v;
			glGetBufferParameteriv(GL_DRAW_INDIRECT_BUFFER, GL_BUFFER_ACCESS, &v);
			if (v != static_cast<int>(access))
			{
				result.error() << "glGetBufferParameteriv(GL_BUFFER_ACCESS) returned incorrect state: "
							   << AccessToString(v) << ", expected: " << AccessToString(access);
			}
		}

		int v;
		glGetBufferParameteriv(GL_DRAW_INDIRECT_BUFFER, GL_BUFFER_ACCESS_FLAGS, &v);
		if (v != static_cast<int>(accessFlag))
		{
			result.error() << "glGetBufferParameteriv(GL_BUFFER_ACCESS_FLAGS) returned incorrect state: " << v
						   << ", expected: " << accessFlag;
		}

		glGetBufferParameteriv(GL_DRAW_INDIRECT_BUFFER, GL_BUFFER_MAPPED, &v);
		if (v != mapped)
		{
			result.error() << "glGetBufferParameteriv(GL_BUFFER_MAPPED) returned incorrect state: "
						   << BoolToString((GLboolean)v) << ", expected: " << BoolToString((GLboolean)access);
		}

		glGetBufferParameteriv(GL_DRAW_INDIRECT_BUFFER, GL_BUFFER_MAP_OFFSET, &v);
		if (v != offset)
		{
			result.error() << "glGetBufferParameteriv(GL_BUFFER_MAP_OFFSET) returned incorrect offset: " << v
						   << ", expected: " << offset;
		}

		glGetBufferParameteriv(GL_DRAW_INDIRECT_BUFFER, GL_BUFFER_MAP_LENGTH, &v);
		if (v != length)
		{
			result.error() << "glGetBufferParameteriv(GL_BUFFER_MAP_LENGTH) returned incorrect length: " << v
						   << ", expected: " << length;
		}

		return result.code();
	}